

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::TriangleInterpolationTestInstance::generateVertices
          (TriangleInterpolationTestInstance *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outVertices,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outColors)

{
  size_type sVar1;
  reference pvVar2;
  float *pfVar3;
  float fVar4;
  int local_78;
  float w;
  int vtxNdx;
  undefined1 local_68 [8];
  Random rnd;
  Vec4 colors [3];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outColors_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outVertices_local;
  int iteration_local;
  TriangleInterpolationTestInstance *this_local;
  
  colors[2].m_data._8_8_ = outColors;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&rnd.m_rnd.z,1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[0].m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colors[1].m_data + 2),0.0,0.0,1.0,1.0);
  de::Random::Random((Random *)local_68,iteration * 1000 + 0x7b + this->m_primitiveTopology);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outVertices,6)
  ;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             colors[2].m_data._8_8_,6);
  local_78 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      (outVertices);
    if ((int)sVar1 <= local_78) break;
    fVar4 = de::Random::getFloat((Random *)local_68,-0.9,0.9);
    pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (outVertices,(long)local_78);
    pfVar3 = tcu::Vector<float,_4>::x(pvVar2);
    *pfVar3 = fVar4;
    fVar4 = de::Random::getFloat((Random *)local_68,-0.9,0.9);
    pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (outVertices,(long)local_78);
    pfVar3 = tcu::Vector<float,_4>::y(pvVar2);
    *pfVar3 = fVar4;
    pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (outVertices,(long)local_78);
    pfVar3 = tcu::Vector<float,_4>::z(pvVar2);
    *pfVar3 = 0.0;
    if ((this->m_projective & 1U) == 0) {
      pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](outVertices,(long)local_78);
      pfVar3 = tcu::Vector<float,_4>::w(pvVar2);
      *pfVar3 = 1.0;
    }
    else {
      fVar4 = de::Random::getFloat((Random *)local_68,0.2,4.0);
      pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](outVertices,(long)local_78);
      pfVar3 = tcu::Vector<float,_4>::x(pvVar2);
      *pfVar3 = fVar4 * *pfVar3;
      pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](outVertices,(long)local_78);
      pfVar3 = tcu::Vector<float,_4>::y(pvVar2);
      *pfVar3 = fVar4 * *pfVar3;
      pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](outVertices,(long)local_78);
      pfVar3 = tcu::Vector<float,_4>::z(pvVar2);
      *pfVar3 = fVar4 * *pfVar3;
      pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[](outVertices,(long)local_78);
      pfVar3 = tcu::Vector<float,_4>::w(pvVar2);
      *pfVar3 = fVar4;
    }
    pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        colors[2].m_data._8_8_,(long)local_78);
    *(undefined8 *)pvVar2->m_data = *(undefined8 *)(colors[(long)(local_78 % 3) + -1].m_data + 2);
    *(undefined8 *)(pvVar2->m_data + 2) = *(undefined8 *)colors[local_78 % 3].m_data;
    local_78 = local_78 + 1;
  }
  de::Random::~Random((Random *)local_68);
  return;
}

Assistant:

void TriangleInterpolationTestInstance::generateVertices (int iteration, std::vector<tcu::Vec4>& outVertices, std::vector<tcu::Vec4>& outColors) const
{
	// use only red, green and blue
	const tcu::Vec4 colors[] =
	{
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f),
	};

	de::Random rnd(123 + iteration * 1000 + (int)m_primitiveTopology);

	outVertices.resize(6);
	outColors.resize(6);

	for (int vtxNdx = 0; vtxNdx < (int)outVertices.size(); ++vtxNdx)
	{
		outVertices[vtxNdx].x() = rnd.getFloat(-0.9f, 0.9f);
		outVertices[vtxNdx].y() = rnd.getFloat(-0.9f, 0.9f);
		outVertices[vtxNdx].z() = 0.0f;

		if (!m_projective)
			outVertices[vtxNdx].w() = 1.0f;
		else
		{
			const float w = rnd.getFloat(0.2f, 4.0f);

			outVertices[vtxNdx].x() *= w;
			outVertices[vtxNdx].y() *= w;
			outVertices[vtxNdx].z() *= w;
			outVertices[vtxNdx].w() = w;
		}

		outColors[vtxNdx] = colors[vtxNdx % DE_LENGTH_OF_ARRAY(colors)];
	}
}